

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdGetTxInWitness(void *handle,int net_type,char *tx_hex_string,uint32_t txin_index,
                     uint32_t stack_index,char **stack_data)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  ulong uVar4;
  ulong uVar5;
  bool is_bitcoin;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  TransactionContext tx;
  TxInReference ref;
  bool local_299;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_298;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_280;
  ScriptWitness local_268;
  ConfidentialTxInReference local_248;
  undefined1 local_e8 [184];
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    local_248.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x5f647a;
    local_248.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x9f1;
    local_248.super_AbstractTxInReference.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "CfdGetTxInWitness";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_248,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_248.super_AbstractTxInReference._vptr_AbstractTxInReference =
         (_func_int **)&local_248.super_AbstractTxInReference.txid_.data_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_248);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (stack_data != (char **)0x0) {
    local_298.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_299 = false;
    cfd::capi::ConvertNetType(net_type,&local_299);
    if (local_299 == true) {
      std::__cxx11::string::string((string *)local_e8,tx_hex_string,(allocator *)&local_268);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)&local_248,(string *)local_e8);
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_);
      }
      cfd::core::Transaction::GetTxIn
                ((TxInReference *)local_e8,(Transaction *)&local_248,txin_index);
      local_268._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00735628;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                (&local_268.witness_stack_,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 (local_e8 + 0x78));
      cfd::core::ScriptWitness::GetWitness(&local_280,&local_268);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_298,&local_280);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_280);
      local_268._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00735628;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                (&local_268.witness_stack_);
      cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)local_e8);
      cfd::TransactionContext::~TransactionContext((TransactionContext *)&local_248);
    }
    else {
      std::__cxx11::string::string((string *)&local_248,tx_hex_string,(allocator *)&local_268);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_e8,(string *)&local_248);
      if ((ByteData *)local_248.super_AbstractTxInReference._vptr_AbstractTxInReference !=
          &local_248.super_AbstractTxInReference.txid_.data_) {
        operator_delete(local_248.super_AbstractTxInReference._vptr_AbstractTxInReference);
      }
      cfd::core::ConfidentialTransaction::GetTxIn
                (&local_248,(ConfidentialTransaction *)local_e8,txin_index);
      local_268._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00735628;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                (&local_268.witness_stack_,
                 &local_248.super_AbstractTxInReference.script_witness_.witness_stack_);
      cfd::core::ScriptWitness::GetWitness(&local_280,&local_268);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_298,&local_280);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_280);
      local_268._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00735628;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                (&local_268.witness_stack_);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_248);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_e8);
    }
    uVar5 = ((long)local_298.
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_298.
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    uVar4 = (ulong)stack_index;
    if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&local_248,
                 local_298.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar4);
      pcVar2 = cfd::capi::CreateString((string *)&local_248);
      *stack_data = pcVar2;
      if ((ByteData *)local_248.super_AbstractTxInReference._vptr_AbstractTxInReference !=
          &local_248.super_AbstractTxInReference.txid_.data_) {
        operator_delete(local_248.super_AbstractTxInReference._vptr_AbstractTxInReference);
      }
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_298);
      return 0;
    }
    local_248.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x5f647a;
    local_248.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0xa10;
    local_248.super_AbstractTxInReference.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "CfdGetTxInWitness";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_248,kCfdLogLevelWarning,"stackIndex is illegal.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_248.super_AbstractTxInReference._vptr_AbstractTxInReference =
         (_func_int **)&local_248.super_AbstractTxInReference.txid_.data_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"Failed to parameter. stackIndex out of witness stack.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdOutOfRangeError,(string *)&local_248);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_248.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x5f647a;
  local_248.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x9f7;
  local_248.super_AbstractTxInReference.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "CfdGetTxInWitness";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_248,kCfdLogLevelWarning,"stack data is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_248.super_AbstractTxInReference._vptr_AbstractTxInReference =
       (_func_int **)&local_248.super_AbstractTxInReference.txid_.data_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"Failed to parameter. stack data is null.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_248);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInWitness(
    void* handle, int net_type, const char* tx_hex_string, uint32_t txin_index,
    uint32_t stack_index, char** stack_data) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (stack_data == nullptr) {
      warn(CFD_LOG_SOURCE, "stack data is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. stack data is null.");
    }

    std::vector<ByteData> witness_stack;
    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      const TxInReference ref = tx.GetTxIn(txin_index);
      witness_stack = ref.GetScriptWitness().GetWitness();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      const ConfidentialTxInReference ref = tx.GetTxIn(txin_index);
      witness_stack = ref.GetScriptWitness().GetWitness();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (witness_stack.size() <= stack_index) {
      warn(CFD_LOG_SOURCE, "stackIndex is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. stackIndex out of witness stack.");
    }
    *stack_data = CreateString(witness_stack[stack_index].GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}